

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_suite.cpp
# Opt level: O3

void number_suite::test_float_nan(void)

{
  encoder_type encoder;
  ostringstream result;
  undefined4 local_1d0;
  float local_1cc;
  long *local_1c8 [2];
  long local_1b8 [2];
  undefined **local_1a8 [5];
  ostringstream local_180 [112];
  ios_base local_110 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_180);
  local_1a8[0] = &PTR__base_00118c10;
  local_1cc = NAN;
  local_1a8[1] = (undefined **)local_180;
  local_1c8[0] = (long *)trial::protocol::json::detail::basic_encoder<char,_24UL>::
                         floating_value<float>((basic_encoder<char,_24UL> *)local_1a8,&local_1cc);
  local_1d0 = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("encoder.value(std::numeric_limits<float>::quiet_NaN())","4",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,0x1fb,"void number_suite::test_float_nan()",local_1c8,&local_1d0);
  std::__cxx11::stringbuf::str();
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[5]>
            ("result.str()","\"null\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,0x1fc,"void number_suite::test_float_nan()",local_1c8,"null");
  if (local_1c8[0] != local_1b8) {
    operator_delete(local_1c8[0],local_1b8[0] + 1);
  }
  (*(code *)*local_1a8[0])();
  std::__cxx11::ostringstream::~ostringstream(local_180);
  std::ios_base::~ios_base(local_110);
  return;
}

Assistant:

void test_float_nan()
{
    std::ostringstream result;
    encoder_type encoder(result);
    TRIAL_PROTOCOL_TEST_EQUAL(encoder.value(std::numeric_limits<float>::quiet_NaN()), 4);
    TRIAL_PROTOCOL_TEST_EQUAL(result.str(), "null");
}